

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O1

void SimpleBVH::point_triangle_squared_distance
               (VectorMax3d *x,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *f,VectorMax3d *pt,
               double *dist)

{
  plainobjectbase_evaluator_data<double,_0> pVar1;
  plainobjectbase_evaluator_data<double,_0> pVar2;
  Index *pIVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Index size;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  SrcEvaluatorType srcEvaluator_2;
  long lVar13;
  long lVar14;
  scalar_sum_op<double,_double> *func;
  long lVar15;
  SrcEvaluatorType srcEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  ActualDstType actualDst;
  double dVar16;
  double dVar17;
  Scalar SVar18;
  double dVar19;
  Scalar SVar20;
  Scalar SVar21;
  double dVar22;
  double dVar23;
  undefined1 local_1a8 [8];
  VectorMax3d ax;
  VectorMax3d bx;
  VectorMax3d cx;
  undefined1 local_f8 [16];
  plainobjectbase_evaluator_data<double,_0> local_e8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *local_e0;
  variable_if_dynamic<long,__1> local_d0;
  scalar_constant_op<double> local_c0;
  double local_a8;
  VectorMax3d ab;
  VectorMax3d ac;
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> local_31;
  
  pVar1.data = (double *)(f->_M_elems + 1);
  local_f8._0_8_ = pVar1.data;
  local_f8._8_8_ = f;
  if (f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
      == f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
         m_rows) {
    pVar2.data = (double *)(f->_M_elems + 2);
    local_f8._8_8_ = f;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)&local_a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                *)local_f8);
    local_f8._0_8_ = pVar2.data;
    local_f8._8_8_ = f;
    if ((f->_M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
         m_rows == f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                   m_storage.m_rows) &&
       (local_f8._8_8_ = f,
       Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
       PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                 ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                  &ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
                  ,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                    *)local_f8), local_f8._0_8_ = x, local_f8._8_8_ = f,
       (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
       f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
       )) {
      local_f8._8_8_ = f;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_1a8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                  *)local_f8);
      if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2]) goto LAB_00116d74;
      ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
           (Index)&local_a8;
      if (ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != 0.0) {
        if (0 < (long)ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2]) {
          local_f8._8_8_ = &local_a8;
          local_e8.data = (double *)local_1a8;
          dVar16 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_f8,
                              (scalar_sum_op<double,_double> *)
                              &ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                               *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows);
          goto LAB_0011632c;
        }
LAB_00116d93:
        pcVar11 = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
        ;
        goto LAB_00116dde;
      }
      dVar16 = 0.0;
LAB_0011632c:
      if (ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2]) goto LAB_00116d74;
      ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
           (Index)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
      ;
      SVar21 = 0.0;
      if (ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != 0.0) {
        if ((long)ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] < 1) goto LAB_00116d93;
        local_f8._8_8_ =
             &ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
        local_e8.data = (double *)local_1a8;
        SVar21 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                           ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                             *)local_f8,
                            (scalar_sum_op<double,_double> *)
                            &ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                             m_storage.m_rows,
                            (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                             *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows);
      }
      if ((0.0 < dVar16) || (0.0 < SVar21)) {
        local_f8._0_8_ = x;
        local_f8._8_8_ = pVar1.data;
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
            f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_rows) {
          pIVar3 = &ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_rows;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)pIVar3,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                      *)local_f8);
          if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] !=
              bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]) goto LAB_00116d74;
          ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)&local_a8;
          if (bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] == 0.0) {
            dVar17 = 0.0;
          }
          else {
            if ((long)bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2] < 1) goto LAB_00116d93;
            local_f8._8_8_ = &local_a8;
            local_e8.data = (double *)pIVar3;
            dVar17 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                 *)local_f8,
                                (scalar_sum_op<double,_double> *)
                                &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                 m_storage.m_rows,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                 *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_rows);
          }
          if (ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] !=
              bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]) goto LAB_00116d74;
          ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                       m_rows;
          SVar20 = 0.0;
          if (bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] != 0.0) {
            if ((long)bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2] < 1) goto LAB_00116d93;
            local_f8._8_8_ =
                 &ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
            local_e8.data = (double *)pIVar3;
            SVar20 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                 *)local_f8,
                                (scalar_sum_op<double,_double> *)
                                &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                 m_storage.m_rows,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                 *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_rows);
          }
          if ((dVar17 < 0.0) || (dVar17 < SVar20)) {
            local_f8._0_8_ = x;
            local_f8._8_8_ = pVar2.data;
            if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
                == f->_M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                   m_storage.m_rows) {
              pIVar3 = &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_rows;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)pIVar3,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                          *)local_f8);
              if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] !=
                  cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2]) goto LAB_00116d74;
              ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
                   (Index)&local_a8;
              if (cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] == 0.0) {
                SVar18 = 0.0;
              }
              else {
                if ((long)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_data.array[2] < 1) goto LAB_00116d93;
                local_f8._8_8_ = &local_a8;
                local_e8.data = (double *)pIVar3;
                SVar18 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                                   ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                     *)local_f8,&local_31,
                                    (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                     *)&ac.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                        .m_storage.m_rows);
              }
              if (ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] !=
                  cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2]) {
LAB_00116d74:
                __assert_fail("size() == other.size()",
                              "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Dot.h"
                              ,0x52,
                              "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>, OtherDerived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                             );
              }
              ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
                   (Index)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_rows;
              dVar19 = 0.0;
              if (cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] != 0.0) {
                if ((long)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_data.array[2] < 1) goto LAB_00116d93;
                local_f8._8_8_ =
                     &ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_rows;
                local_e8.data = (double *)pIVar3;
                dVar19 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                                   ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                     *)local_f8,&local_31,
                                    (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                     *)&ac.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                        .m_storage.m_rows);
              }
              if ((dVar19 < 0.0) || (dVar19 < SVar18)) {
                dVar22 = dVar16 * SVar20 - SVar21 * dVar17;
                if ((-dVar17 < dVar17) || ((dVar16 < 0.0 || (0.0 < dVar22)))) {
                  dVar16 = SVar18 * SVar21 - dVar16 * dVar19;
                  if ((0.0 < dVar19) || ((SVar21 < 0.0 || (0.0 < dVar16)))) {
                    dVar23 = dVar17 * dVar19 - SVar20 * SVar18;
                    if ((dVar23 <= 0.0) &&
                       ((dVar17 = SVar20 - dVar17, 0.0 <= dVar17 && (0.0 <= SVar18 - dVar19)))) {
                      lVar13 = f->_M_elems[1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows;
                      if (f->_M_elems[2].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                          m_rows == lVar13) {
                        if (lVar13 < 0) goto LAB_00116e07;
                        local_c0.m_other = dVar17 / ((SVar18 - dVar19) + dVar17);
                        local_f8._0_8_ = pVar1.data;
                        local_e8.data = pVar2.data;
                        local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)pVar1.data;
                        local_d0.m_value = lVar13;
                        Eigen::internal::
                        call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>,Eigen::internal::assign_op<double,double>>
                                  (pt,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                                       *)local_f8,
                                   (assign_op<double,_double> *)
                                   &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_rows);
                        local_f8._0_8_ = x;
                        local_f8._8_8_ = pt;
                        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                            m_storage.m_rows ==
                            (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                            m_storage.m_rows) {
                          dVar16 = Eigen::
                                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                                   ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                                  *)local_f8);
                          goto LAB_00116cca;
                        }
                      }
                      goto LAB_00116d55;
                    }
                    if ((long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2] < 0) {
LAB_00116e07:
                      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                    ,
                                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseNullaryOp.h"
                                    ,0x4a,
                                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                                   );
                    }
                    if ((double)f->_M_elems[0].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows !=
                        ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) goto LAB_00116e26;
                    if ((long)ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2] < 0) goto LAB_00116e07;
                    if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] !=
                        ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) {
                      pcVar11 = 
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>]"
                      ;
                      goto LAB_00116d6a;
                    }
                    if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                m_storage.m_rows !=
                        ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) {
                      if (3 < (ulong)ac.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[2]) goto LAB_00116de8;
                      (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_rows = (Index)ac.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[2];
                    }
                    dVar17 = (double)(pt->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                     m_storage.m_rows;
                    if (dVar17 != ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]) {
                      pcVar11 = 
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, T1 = double, T2 = double]"
                      ;
                      goto LAB_00116dbf;
                    }
                    dVar23 = 1.0 / (dVar23 + dVar16 + dVar22);
                    dVar16 = dVar16 * dVar23;
                    dVar23 = dVar23 * dVar22;
                    dVar19 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
                    if ((long)dVar17 <= (long)dVar19) {
                      dVar19 = dVar17;
                    }
                    lVar13 = (long)dVar17 - (long)dVar19;
                    if (0 < (long)dVar19) {
                      (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_data.array[0] =
                           (double)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                   m_storage.m_rows * dVar23 +
                           local_a8 * dVar16 +
                           f->_M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0];
                    }
                    lVar14 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar19;
                    dVar22 = dVar19;
                    if (1 < lVar13) {
                      do {
                        pdVar5 = f->_M_elems[0].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + (long)dVar22;
                        dVar7 = pdVar5[1];
                        dVar8 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[(long)dVar22];
                        dVar9 = ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[(long)dVar22];
                        pdVar4 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                                 .m_storage.m_data.array + (long)dVar22;
                        *pdVar4 = *(double *)
                                   ((long)(&ab.
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                            .m_storage.m_data + 1) + dVar22 * 8) * dVar23 +
                                  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[(long)dVar22 - 1] * dVar16 + *pdVar5;
                        pdVar4[1] = dVar9 * dVar23 + dVar8 * dVar16 + dVar7;
                        dVar22 = (double)((long)dVar22 + 2);
                      } while ((long)dVar22 < lVar14);
                    }
                    if (lVar14 < (long)dVar17) {
                      lVar14 = lVar13 / 2;
                      lVar15 = 0;
                      do {
                        (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[(long)dVar19 + lVar14 * 2 + lVar15] =
                             ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[(long)dVar19 + lVar14 * 2 + lVar15 + -1] *
                             dVar23 + ab.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array
                                      [(long)dVar19 + lVar14 * 2 + lVar15 + -1] * dVar16 +
                                      f->_M_elems[0].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[(long)dVar19 + lVar14 * 2 + lVar15];
                        lVar15 = lVar15 + 1;
                      } while (lVar13 % 2 != lVar15);
                    }
                  }
                  else {
                    if ((long)ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2] < 0) goto LAB_00116e07;
                    if ((double)f->_M_elems[0].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows !=
                        ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) goto LAB_00116e26;
                    if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                m_storage.m_rows !=
                        ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) {
                      if (3 < (ulong)ac.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[2]) goto LAB_00116de8;
                      (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_rows = (Index)ac.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[2];
                    }
                    dVar16 = (double)(pt->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                     m_storage.m_rows;
                    if (dVar16 != ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]) goto LAB_00116e40;
                    dVar17 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
                    if ((long)dVar16 <= (long)dVar17) {
                      dVar17 = dVar16;
                    }
                    dVar19 = SVar21 / (SVar21 - dVar19);
                    lVar13 = (long)dVar16 - (long)dVar17;
                    if (0 < (long)dVar17) {
                      (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_data.array[0] =
                           (double)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                   m_storage.m_rows * dVar19 +
                           f->_M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0];
                    }
                    dVar22 = (double)((lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) +
                                     (long)dVar17);
                    if (1 < lVar13) {
                      do {
                        pdVar5 = f->_M_elems[0].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + (long)dVar17;
                        dVar23 = pdVar5[1];
                        dVar7 = ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[(long)dVar17];
                        pdVar4 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                                 .m_storage.m_data.array + (long)dVar17;
                        *pdVar4 = *(double *)
                                   ((long)(&ab.
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                            .m_storage.m_data + 1) + dVar17 * 8) * dVar19 + *pdVar5;
                        pdVar4[1] = dVar7 * dVar19 + dVar23;
                        dVar17 = (double)((long)dVar17 + 2);
                      } while ((long)dVar17 < (long)dVar22);
                    }
                    if ((long)dVar22 < (long)dVar16) {
                      do {
                        (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[(long)dVar22] =
                             *(double *)
                              ((long)(&ab.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                       .m_storage.m_data + 1) + dVar22 * 8) * dVar19 +
                             f->_M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                             .m_data.array[(long)dVar22];
                        dVar22 = (double)((long)dVar22 + 1);
                      } while (dVar16 != dVar22);
                    }
                  }
                }
                else {
                  if ((long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[2] < 0) goto LAB_00116e07;
                  if ((double)f->_M_elems[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_rows !=
                      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2]) {
LAB_00116e26:
                    pcVar11 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>]"
                    ;
                    goto LAB_00116d6a;
                  }
                  if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                              m_storage.m_rows !=
                      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2]) {
                    if (3 < (ulong)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2]) goto LAB_00116de8;
                    (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows = (Index)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_data.array[2];
                  }
                  dVar19 = (double)(pt->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                   m_storage.m_rows;
                  if (dVar19 != ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[2]) {
LAB_00116e40:
                    pcVar11 = 
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, T1 = double, T2 = double]"
                    ;
                    goto LAB_00116dbf;
                  }
                  dVar22 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
                  if ((long)dVar19 <= (long)dVar22) {
                    dVar22 = dVar19;
                  }
                  dVar16 = dVar16 / (dVar16 - dVar17);
                  lVar13 = (long)dVar19 - (long)dVar22;
                  if (0 < (long)dVar22) {
                    (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_data.array[0] =
                         local_a8 * dVar16 +
                         f->_M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[0];
                  }
                  dVar17 = (double)((lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar22
                                   );
                  if (1 < lVar13) {
                    do {
                      pdVar5 = f->_M_elems[0].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + (long)dVar22;
                      dVar23 = pdVar5[1];
                      dVar7 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[(long)dVar22];
                      pdVar4 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + (long)dVar22;
                      *pdVar4 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[(long)dVar22 - 1] * dVar16 + *pdVar5;
                      pdVar4[1] = dVar7 * dVar16 + dVar23;
                      dVar22 = (double)((long)dVar22 + 2);
                    } while ((long)dVar22 < (long)dVar17);
                  }
                  if ((long)dVar17 < (long)dVar19) {
                    do {
                      (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_data.array[(long)dVar17] =
                           ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[(long)dVar17 - 1] * dVar16 +
                           f->_M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[(long)dVar17];
                      dVar17 = (double)((long)dVar17 + 1);
                    } while (dVar19 != dVar17);
                  }
                }
                if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                              m_storage.m_rows) {
                  lVar13 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                           m_storage.m_rows;
joined_r0x00116ca0:
                  if (lVar13 == 0) goto LAB_00116cc6;
                  if (lVar13 < 1) goto LAB_00116dc9;
                  func = &local_31;
                  goto LAB_00116cb8;
                }
              }
              else {
                uVar12 = f->_M_elems[2].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_rows;
                if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows != uVar12) {
                  if (3 < uVar12) {
LAB_00116de8:
                    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                  ,
                                  "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                                  ,0x115,
                                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                                 );
                  }
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_rows = uVar12;
                }
                uVar6 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                        m_storage.m_rows;
                if (uVar6 != uVar12) goto LAB_00116daa;
                uVar12 = (ulong)((uint)((ulong)pt >> 3) & 1);
                if ((long)uVar6 <= (long)uVar12) {
                  uVar12 = uVar6;
                }
                lVar13 = uVar6 - uVar12;
                if (0 < (long)uVar12) {
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] = *pVar2.data;
                }
                uVar10 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
                if (1 < lVar13) {
                  do {
                    dVar16 = *(double *)
                              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                               (pVar2.data + uVar12) + 8);
                    pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + uVar12;
                    *pdVar5 = pVar2.data[uVar12];
                    pdVar5[1] = dVar16;
                    uVar12 = uVar12 + 2;
                  } while ((long)uVar12 < (long)uVar10);
                }
                if ((long)uVar10 < (long)uVar6) {
                  do {
                    (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_data.array[uVar10] = *(double *)(pVar2.data + uVar10);
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                }
                if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                              m_storage.m_rows) {
                  lVar13 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                           m_storage.m_rows;
                  goto joined_r0x00116ca0;
                }
              }
            }
          }
          else {
            uVar12 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_rows;
            if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
                != uVar12) {
              if (3 < uVar12) goto LAB_00116de8;
              (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows =
                   uVar12;
            }
            uVar6 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_rows;
            if (uVar6 != uVar12) goto LAB_00116daa;
            uVar12 = (ulong)((uint)((ulong)pt >> 3) & 1);
            if ((long)uVar6 <= (long)uVar12) {
              uVar12 = uVar6;
            }
            lVar13 = uVar6 - uVar12;
            if (0 < (long)uVar12) {
              (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0] = *pVar1.data;
            }
            uVar10 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
            if (1 < lVar13) {
              do {
                dVar16 = *(double *)
                          ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                           (pVar1.data + uVar12) + 8);
                pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                         m_storage.m_data.array + uVar12;
                *pdVar5 = pVar1.data[uVar12];
                pdVar5[1] = dVar16;
                uVar12 = uVar12 + 2;
              } while ((long)uVar12 < (long)uVar10);
            }
            if ((long)uVar10 < (long)uVar6) {
              do {
                (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data
                .array[uVar10] = *(double *)(pVar1.data + uVar10);
                uVar10 = uVar10 + 1;
              } while (uVar6 != uVar10);
            }
            if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
                == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                   m_rows) {
              lVar13 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
                       .m_rows;
              if (lVar13 != 0) {
                if (lVar13 < 1) goto LAB_00116dc9;
                func = (scalar_sum_op<double,_double> *)
                       &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_rows;
                goto LAB_00116cb8;
              }
              goto LAB_00116cc6;
            }
          }
        }
      }
      else {
        uVar12 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_rows;
        if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows !=
            uVar12) {
          if (3 < uVar12) goto LAB_00116de8;
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows =
               uVar12;
        }
        uVar6 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
        ;
        if (uVar6 != uVar12) {
LAB_00116daa:
          pcVar11 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, T1 = double, T2 = double]"
          ;
LAB_00116dbf:
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,pcVar11);
        }
        uVar12 = (ulong)((uint)((ulong)pt >> 3) & 1);
        if ((long)uVar6 <= (long)uVar12) {
          uVar12 = uVar6;
        }
        lVar13 = uVar6 - uVar12;
        if (0 < (long)uVar12) {
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0] = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0];
        }
        uVar10 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
        if (1 < lVar13) {
          do {
            pdVar5 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + uVar12;
            dVar16 = pdVar5[1];
            pdVar4 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                     m_data.array + uVar12;
            *pdVar4 = *pdVar5;
            pdVar4[1] = dVar16;
            uVar12 = uVar12 + 2;
          } while ((long)uVar12 < (long)uVar10);
        }
        if ((long)uVar10 < (long)uVar6) {
          do {
            (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[uVar10] =
                 f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
        }
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
            (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows) {
          lVar13 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                   m_rows;
          if (lVar13 == 0) {
LAB_00116cc6:
            dVar16 = 0.0;
            goto LAB_00116cca;
          }
          if (lVar13 < 1) {
LAB_00116dc9:
            pcVar11 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            local_f8._8_8_ = x;
            local_e8.data = (double *)pt;
LAB_00116dde:
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Redux.h"
                          ,0x19b,pcVar11);
          }
          func = (scalar_sum_op<double,_double> *)
                 &ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
LAB_00116cb8:
          local_f8._8_8_ = x;
          local_e8.data = (double *)pt;
          dVar16 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                               *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows,func,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_f8);
LAB_00116cca:
          *dist = dVar16;
          return;
        }
      }
    }
  }
LAB_00116d55:
  pcVar11 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
  ;
LAB_00116d6a:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,pcVar11);
}

Assistant:

void point_triangle_squared_distance(
    const VectorMax3d& x,
    const std::array<VectorMax3d, 3>& f,
    VectorMax3d& pt,
    double& dist)
{
    const VectorMax3d& pa = f[0];
    const VectorMax3d& pb = f[1];
    const VectorMax3d& pc = f[2];

    // source: real time collision detection
    // check if x in vertex region outside pa
    VectorMax3d ab = pb - pa;
    VectorMax3d ac = pc - pa;
    VectorMax3d ax = x - pa;
    const double d1 = ab.dot(ax);
    const double d2 = ac.dot(ax);
    if (d1 <= 0 && d2 <= 0) {
        // barycentric coordinates (1, 0, 0)
        pt = pa;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pb
    VectorMax3d bx = x - pb;
    const double d3 = ab.dot(bx);
    const double d4 = ac.dot(bx);
    if (d3 >= 0.0f && d4 <= d3) {
        // barycentric coordinates (0, 1, 0)
        pt = pb;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pc
    VectorMax3d cx = x - pc;
    const double d5 = ab.dot(cx);
    const double d6 = ac.dot(cx);
    if (d6 >= 0.0f && d5 <= d6) {
        // barycentric coordinates (0, 0, 1)
        pt = pc;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ab, if so return projection of x onto ab
    const double vc = d1 * d4 - d3 * d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        // barycentric coordinates (1 - v, v, 0)
        const double v = d1 / (d1 - d3);
        pt = pa + ab * v;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ac, if so return projection of x onto ac
    const double vb = d5 * d2 - d1 * d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        // barycentric coordinates (1 - w, 0, w)
        const double w = d2 / (d2 - d6);
        pt = pa + ac * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of bc, if so return projection of x onto bc
    const double va = d3 * d6 - d5 * d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        // barycentric coordinates (0, 1 - w, w)
        const double w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        pt = pb + (pc - pb) * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // x inside face region. Compute pt through its barycentric coordinates (u,
    // v, w)
    const double denom = 1 / (va + vb + vc);
    const double v = vb * denom;
    const double w = vc * denom;

    pt = pa + ab * v + ac * w; //= u*a + v*b + w*c, u = va*denom = 1.0f - v - w
    dist = (x - pt).squaredNorm();
}